

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O3

string * __thiscall
verilogAST::ModuleInstantiation::toString_abi_cxx11_
          (string *__return_storage_ptr__,ModuleInstantiation *this)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Connections *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  pointer *ppbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar10;
  undefined8 uVar11;
  __index_type *p_Var12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_strs_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  pointer *local_160;
  long local_158;
  pointer local_150;
  undefined4 uStack_148;
  undefined4 uStack_144;
  string *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  ModuleInstantiation *local_b0;
  undefined1 *local_a8;
  string local_a0;
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->module_name)._M_dataplus._M_p);
  local_140 = __return_storage_ptr__;
  if (*(long *)&this->parameters != *(long *)&this->field_0x30) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_d8._M_allocated_capacity = 0;
    local_d8._8_8_ = 0;
    local_c8 = 0;
    p_Var12 = *(__index_type **)&this->parameters;
    local_a8 = *(undefined1 **)&this->field_0x30;
    local_b0 = this;
    if (p_Var12 != local_a8) {
      do {
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/verilogAST.cpp:10:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
          ::_S_vtable._M_arr[p_Var12[8]]._M_data)
                  (&local_138,(anon_class_1_0_00000001 *)local_f8,
                   (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                    *)p_Var12);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x164f77);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_118.field_2._M_allocated_capacity = *psVar8;
          local_118.field_2._8_8_ = plVar6[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar8;
          local_118._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_118._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
        ppbVar9 = (pointer *)(plVar6 + 2);
        if ((pointer *)*plVar6 == ppbVar9) {
          local_150 = *ppbVar9;
          uStack_148 = (undefined4)plVar6[3];
          uStack_144 = *(undefined4 *)((long)plVar6 + 0x1c);
          local_160 = &local_150;
        }
        else {
          local_150 = *ppbVar9;
          local_160 = (pointer *)*plVar6;
        }
        local_158 = plVar6[1];
        *plVar6 = (long)ppbVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        (**(code **)**(undefined8 **)
                      &(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                          *)(p_Var12 + 0x10))->
                       super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                       ).
                       super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                       .
                       super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                       .
                       super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                       .
                       super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        )((anon_class_1_0_00000001 *)local_f8);
        pbVar10 = (pointer)0xf;
        if (local_160 != &local_150) {
          pbVar10 = local_150;
        }
        pbVar1 = (pointer)((long)&((_Alloc_hider *)local_f8._8_8_)->_M_p + local_158);
        if (pbVar10 < pbVar1) {
          pbVar10 = (pointer)0xf;
          if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
            pbVar10 = (pointer)local_f8._16_8_;
          }
          if (pbVar10 < pbVar1) goto LAB_0014577a;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,(ulong)local_160);
        }
        else {
LAB_0014577a:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_160,local_f8._0_8_);
        }
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_180.field_2._M_allocated_capacity = *psVar8;
          local_180.field_2._8_8_ = puVar7[3];
        }
        else {
          local_180.field_2._M_allocated_capacity = *psVar8;
          local_180._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_180._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)psVar8 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_180);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_1a0.field_2._M_allocated_capacity = *psVar8;
          local_1a0.field_2._8_8_ = plVar6[3];
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar8;
          local_1a0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_1a0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_d8._M_local_buf,&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_f8._16_8_)->_M_p + 1));
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,(ulong)((long)&(local_150->_M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
        p_Var12 = p_Var12 + 0x18;
      } while (p_Var12 != local_a8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_d8);
    __return_storage_ptr__ = local_140;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,",\n    ","");
    join(&local_1a0,&local_48,&local_80);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    this = local_b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
  }
  std::operator+(&local_180," ",&this->instance_name);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_180);
  paVar2 = &local_1a0.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1a0.field_2._M_allocated_capacity = *psVar8;
    local_1a0.field_2._8_8_ = plVar6[3];
    local_1a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar8;
    local_1a0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1a0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_180.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar3) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  pCVar4 = (this->connections)._M_t.
           super___uniq_ptr_impl<verilogAST::Connections,_std::default_delete<verilogAST::Connections>_>
           ._M_t.
           super__Tuple_impl<0UL,_verilogAST::Connections_*,_std::default_delete<verilogAST::Connections>_>
           .super__Head_base<0UL,_verilogAST::Connections_*,_false>._M_head_impl;
  if (*(long *)pCVar4 != *(long *)(pCVar4 + 8)) {
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = (pointer)0x0;
    __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pCVar4;
    pbVar5 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pCVar4 + 8);
    if (__rhs != pbVar5) {
      do {
        std::operator+(&local_118,".",__rhs);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
        ppbVar9 = (pointer *)(plVar6 + 2);
        if ((pointer *)*plVar6 == ppbVar9) {
          local_150 = *ppbVar9;
          uStack_148 = (undefined4)plVar6[3];
          uStack_144 = *(undefined4 *)((long)plVar6 + 0x1c);
          local_160 = &local_150;
        }
        else {
          local_150 = *ppbVar9;
          local_160 = (pointer *)*plVar6;
        }
        local_158 = plVar6[1];
        *plVar6 = (long)ppbVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        (*(code *)**(undefined8 **)__rhs[1]._M_dataplus._M_p)(&local_138);
        pbVar10 = (pointer)0xf;
        if (local_160 != &local_150) {
          pbVar10 = local_150;
        }
        if (pbVar10 < (pointer)(local_138._M_string_length + local_158)) {
          uVar11 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar11 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < (pointer)(local_138._M_string_length + local_158)) goto LAB_00145b93;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_160);
        }
        else {
LAB_00145b93:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)local_138._M_dataplus._M_p);
        }
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_180.field_2._M_allocated_capacity = *psVar8;
          local_180.field_2._8_8_ = puVar7[3];
          local_180._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_180.field_2._M_allocated_capacity = *psVar8;
          local_180._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_180._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)psVar8 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_180);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_1a0.field_2._M_allocated_capacity = *psVar8;
          local_1a0.field_2._8_8_ = plVar6[3];
          local_1a0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar8;
          local_1a0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_1a0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f8,
                   &local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar3) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,(ulong)((long)&(local_150->_M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &__rhs[1]._M_string_length;
      } while (__rhs != pbVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8);
    __return_storage_ptr__ = local_140;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,",\n    ","");
    join(&local_1a0,&local_60,&local_a0);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleInstantiation::toString() {
  std::string module_inst_str = "";
  module_inst_str += module_name;
  if (!parameters.empty()) {
    module_inst_str += " #(\n    ";
    std::vector<std::string> param_strs;
    for (auto &it : parameters) {
      param_strs.push_back("." + variant_to_string(it.first) + "(" +
                           it.second->toString() + ")");
    }
    module_inst_str += join(param_strs, ",\n    ");
    module_inst_str += "\n)";
  }
  module_inst_str += " " + instance_name + " (\n    ";
  if (!connections->empty()) {
    std::vector<std::string> param_strs;
    for (auto &it : *connections) {
      param_strs.push_back("." + it.first + "(" + it.second->toString() + ")");
    }
    module_inst_str += join(param_strs, ",\n    ");
  }
  module_inst_str += "\n);";
  return module_inst_str;
}